

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb_hexamine.cc
# Opt level: O0

int process_file(input_option *opt)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  filemgr_ops *pfVar4;
  ulong __size;
  ssize_t sVar5;
  fdb_file_handle *fhandle;
  undefined8 *in_RDI;
  ssize_t rv_1;
  uint64_t i_1;
  ssize_t rv;
  uint64_t i;
  fdb_status fs;
  uint8_t block_buf [4096];
  filemgr file;
  size_t num_blocks;
  uint64_t file_size;
  char *filename;
  fdb_config config;
  fdb_file_handle *dbfile;
  fdb_file_handle *in_stack_ffffffffffffeac8;
  void *local_1530;
  void *in_stack_ffffffffffffeae0;
  void *block;
  undefined1 local_1518 [252];
  fdb_status local_141c;
  undefined1 local_1418 [256];
  fdb_config *in_stack_ffffffffffffece8;
  char *in_stack_ffffffffffffecf0;
  fdb_file_handle **in_stack_ffffffffffffecf8;
  uint8_t local_409;
  fdb_kvs_handle *in_stack_fffffffffffffcb8;
  undefined1 local_110 [8];
  undefined8 local_108;
  undefined4 local_ec;
  undefined8 local_18;
  undefined8 *local_10;
  int local_4;
  
  local_18 = 0;
  pcVar1 = (char *)*in_RDI;
  local_10 = in_RDI;
  fdb_get_default_config();
  memcpy(local_110,local_1518,0xf8);
  local_108 = 0;
  local_ec = 2;
  pfVar4 = get_filemgr_ops();
  iVar2 = (*pfVar4->open)(pcVar1,2,0x1b6);
  if (iVar2 < 0) {
    printf("\nUnable to open %s\n",pcVar1);
    local_4 = -1;
  }
  else {
    __size = (*pfVar4->file_size)(pcVar1);
    if ((*(byte *)(local_10 + 1) & 1) != 0) {
      local_141c = fdb_open(in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0,
                            in_stack_ffffffffffffece8);
      if (local_141c != FDB_RESULT_SUCCESS) {
        printf("\nUnable to open %s\n",pcVar1);
        return -1;
      }
      print_header(in_stack_fffffffffffffcb8);
    }
    if ((*(byte *)((long)local_10 + 9) & 1) == 0) {
      if ((ulong)local_10[2] < __size) {
        printf("\n File %s size %lu exceeds max size of %lu \n",pcVar1,__size,local_10[2]);
        if ((*(byte *)(local_10 + 1) & 1) != 0) {
          fdb_close(in_stack_ffffffffffffeac8);
        }
        local_4 = -1;
      }
      else {
        db = (dblock *)malloc(__size);
        if (db == (dblock *)0x0) {
          printf("\nUnable to allocate memory of %lu bytes\n",__size);
          if ((*(byte *)(local_10 + 1) & 1) != 0) {
            fdb_close(in_stack_ffffffffffffeac8);
          }
          local_4 = -1;
        }
        else {
          local_1530 = (void *)0x0;
          while( true ) {
            if ((void *)(__size >> 0xc) <= local_1530) {
              uVar3 = getpid();
              printf("\nFile scanned and headers decoded\n gdb --pid=%d\n",(ulong)uVar3);
              do {
                gdb_sleep();
              } while( true );
            }
            fhandle = (fdb_file_handle *)
                      (*pfVar4->pread)(iVar2,db + (long)local_1530,0x1000,(long)local_1530 << 0xc);
            if (fhandle != (fdb_file_handle *)0x1000) break;
            if (db[(long)local_1530].marker == 0xee) {
              printf("\nDB Header %lu",local_1530);
              decode_dblock(in_stack_ffffffffffffeae0);
            }
            local_1530 = (void *)((long)local_1530 + 1);
          }
          if ((*(byte *)(local_10 + 1) & 1) != 0) {
            fdb_close(fhandle);
          }
          free(db);
          local_4 = -5;
        }
      }
    }
    else {
      for (block = (void *)0x0; block < (void *)(__size >> 0xc); block = (void *)((long)block + 1))
      {
        sVar5 = (*pfVar4->pread)(iVar2,local_1418,0x1000,(long)block << 0xc);
        if (sVar5 != 0x1000) {
          fdb_close(in_stack_ffffffffffffeac8);
          return -5;
        }
        db = (dblock *)local_1418;
        if (local_409 == 0xee) {
          printf("\n-------DB Header %lu at offset %lu--------",block,(long)block << 0xc);
          decode_dblock(block);
          printf("\ntrie_root_raw = %p",db->trie_root_raw);
          printf("\nseqtree_root_raw = %p",db->seqtree_root_raw);
          printf("\nnum_docs = %lu",db->num_docs);
          printf("\nnum_nodes = %lu",db->num_nodes);
          printf("\ndatasize = %lu",db->data_size);
          printf("\nlast_wal_flush_bid = %lu",db->last_wal_flush_bid);
          printf("\nkv_info_offset = %lu",db->kv_info_offset);
          printf("\nflags = %p",(db->field_9).hdr_flags);
          printf("\nnew_filename_len = %d",(ulong)db->new_filename_len);
          printf("\nold_filename_len = %d",(ulong)db->old_filename_len);
          printf("\ntrie_root_bid = %lu",db->trie_root_bid);
          printf("\ntrie_subblock_no = %lu",db->trie_subblock_no);
          printf("\ntrie_idx = %lu",db->trie_idx);
          printf("\nseqtree_root_bid = %lu",db->seqtree_root_bid);
          printf("\nseqtree_subblock_no = %lu",db->seqtree_subblock_no);
          printf("\nseqtree_idx = %lu",db->seqtree_idx);
          printf("\ndelta size = %lu",db->delta_size);
          printf("\nprev_hdr_bid = %lu",db->prev_hdr_bid);
          printf("\nhdr_len = %d",(ulong)db->hdr_len);
          printf("\nmagic = %p",(db->field_24).magic_bytes);
        }
      }
      if ((*(byte *)(local_10 + 1) & 1) != 0) {
        local_141c = fdb_close(in_stack_ffffffffffffeac8);
        if (local_141c != FDB_RESULT_SUCCESS) {
          printf("\nUnable to close %s\n",pcVar1);
          return -4;
        }
        local_141c = FDB_RESULT_SUCCESS;
      }
      (*pfVar4->close)(iVar2);
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int process_file(struct input_option *opt)
{
    fdb_file_handle *dbfile = NULL;
    fdb_config config;
    char *filename = opt->filename;
    uint64_t file_size;
    size_t num_blocks;
    struct filemgr file;
    uint8_t block_buf[BLK_SIZE];
    fdb_status fs;

    config = fdb_get_default_config();
    config.buffercache_size = 0;
    config.flags = FDB_OPEN_FLAG_RDONLY;
    file.ops = get_filemgr_ops();
    file.fd = file.ops->open(filename, O_RDWR, 0666);

    if (file.fd < 0) {
        printf("\nUnable to open %s\n", filename);
        return -1;
    }

    file_size = file.ops->file_size(filename);
    num_blocks = file_size / BLK_SIZE;

    if (opt->print_header) {
        fs = fdb_open(&dbfile, filename, &config);
        if (fs != FDB_RESULT_SUCCESS) {
            printf("\nUnable to open %s\n", filename);
            return -1;
        }
        print_header(dbfile->root);
    }
    if (opt->headers_only) {
        for (uint64_t i = 0; i < num_blocks; ++i) {
            ssize_t rv = file.ops->pread(file.fd, &block_buf, BLK_SIZE,
                                          i * BLK_SIZE);
            if (rv != BLK_SIZE) {
                fdb_close(dbfile);
                return FDB_RESULT_READ_FAIL;
            }
            db = (dblock *)&block_buf;

            if (db->marker == DBHEADER_BLK) {
                printf("\n-------DB Header %" _F64 " at offset %" _F64
                        "--------" , i, i * BLK_SIZE);
                decode_dblock(db);
                printf("\ntrie_root_raw = %p", (void*)db->trie_root_raw);
                printf("\nseqtree_root_raw = %p", (void*)db->seqtree_root_raw);
                printf("\nnum_docs = %" _F64, db->num_docs);
                printf("\nnum_nodes = %" _F64, db->num_nodes);
                printf("\ndatasize = %" _F64, db->data_size);
                printf("\nlast_wal_flush_bid = %" _F64, db->last_wal_flush_bid);
                printf("\nkv_info_offset = %" _F64, db->kv_info_offset);
                printf("\nflags = %p", db->flags);
                printf("\nnew_filename_len = %d", db->new_filename_len);
                printf("\nold_filename_len = %d", db->old_filename_len);
                printf("\ntrie_root_bid = %" _F64, db->trie_root_bid);
                printf("\ntrie_subblock_no = %" _F64, db->trie_subblock_no);
                printf("\ntrie_idx = %" _F64, db->trie_idx);
                printf("\nseqtree_root_bid = %" _F64, db->seqtree_root_bid);
                printf("\nseqtree_subblock_no = %" _F64,
                                                 db->seqtree_subblock_no);
                printf("\nseqtree_idx = %" _F64, db->seqtree_idx);
                printf("\ndelta size = %" _F64, db->delta_size);
                printf("\nprev_hdr_bid = %" _F64, db->prev_hdr_bid);
                printf("\nhdr_len = %d", db->hdr_len);
                printf("\nmagic = %p", db->magic);
            }
        }

    } else {
        if (file_size > opt->max_filesize) {
            printf("\n File %s size %" _F64" exceeds max size of %" _F64" \n",
                    filename, file_size, opt->max_filesize);

            if (opt->print_header) {
                fdb_close(dbfile);
            }
            return -1;
        }

        db = (dblock *) malloc(file_size);
        if (!db) {
            printf("\nUnable to allocate memory of %" _F64" bytes\n",
            file_size);

            if (opt->print_header) {
                fdb_close(dbfile);
            }
            return -1;
        }
        for (uint64_t i = 0; i < num_blocks; ++i) {
            ssize_t rv = file.ops->pread(file.fd, &db[i], BLK_SIZE,
                    i * BLK_SIZE);
            if (rv != BLK_SIZE) {
                if (opt->print_header) {
                    fdb_close(dbfile);
                }
                free(db);
                return FDB_RESULT_READ_FAIL;
            }
            if (db[i].marker == DBHEADER_BLK) {
                printf("\nDB Header %" _F64, i);
                decode_dblock(&db[i]);
            }
        }
#if !defined(WIN32) && !defined(_WIN32)
        printf("\nFile scanned and headers decoded\n gdb --pid=%d\n", getpid());
#endif
        while (1) {
            gdb_sleep();
        }
        free(db);
    }

    if (opt->print_header) {
        fs = fdb_close(dbfile);
        if (fs != FDB_RESULT_SUCCESS) {
            printf("\nUnable to close %s\n", filename);
            return -4;
        }
    }

    file.ops->close(file.fd);

    return -1;
}